

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Stress::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  size_type *psVar1;
  int extraout_EAX;
  TestNode *node;
  undefined8 *puVar2;
  long *plVar3;
  DrawTest *this_00;
  long *extraout_RAX;
  ulong *puVar4;
  IndexType type;
  IndexType type_00;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  string desc;
  string iterationDesc;
  string name;
  string local_2c0;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  long *local_280;
  undefined8 local_278;
  long local_270;
  undefined8 uStack_268;
  string local_260;
  long *local_240;
  undefined8 local_238;
  long local_230;
  undefined8 uStack_228;
  string local_220;
  TestNode *local_200;
  DrawTestSpec local_1f8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_buffer","unaligned buffer");
  local_1f8.drawMethod = this->m_method;
  local_1f8.apiType.m_bits = 2;
  local_1f8.primitive = PRIMITIVE_TRIANGLES;
  local_1f8.primitiveCount = 5;
  local_1f8.indexType = INDEXTYPE_LAST;
  local_1f8.indexPointerOffset = 0;
  local_1f8.indexStorage = STORAGE_LAST;
  local_1f8.first = 0;
  local_1f8.indexMin = 0;
  local_1f8.indexMax = 0;
  local_1f8.instanceCount = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_1f8.attribs,2);
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_1f8.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].storage = &DAT_100000001;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  tcu::TestNode::addChild((TestNode *)this,node);
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"index_","");
  deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
            (&local_2c0,(DrawTestSpec *)&DAT_00000001,type);
  uVar7 = 0xf;
  if (local_1a8 != &local_198) {
    uVar7 = local_198;
  }
  if (uVar7 < local_2c0._M_string_length + local_1a0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      uVar8 = local_2c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_2c0._M_string_length + local_1a0) goto LAB_0104fb6d;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_1a8);
  }
  else {
LAB_0104fb6d:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2c0._M_dataplus._M_p);
  }
  local_240 = &local_230;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_230 = *plVar3;
    uStack_228 = puVar2[3];
  }
  else {
    local_230 = *plVar3;
    local_240 = (long *)*puVar2;
  }
  local_238 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"index ","");
  deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
            (&local_260,(DrawTestSpec *)&DAT_00000001,type_00);
  uVar7 = 0xf;
  if (local_2a0 != local_290) {
    uVar7 = local_290[0];
  }
  if (uVar7 < local_260._M_string_length + local_298) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      uVar8 = local_260.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_260._M_string_length + local_298) goto LAB_0104fc8f;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_0104fc8f:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_260._M_dataplus._M_p);
  }
  local_280 = &local_270;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_270 = *plVar3;
    uStack_268 = puVar2[3];
  }
  else {
    local_270 = *plVar3;
    local_280 = (long *)*puVar2;
  }
  local_278 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_280);
  puVar4 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar4) {
    local_198 = *puVar4;
    lStack_190 = plVar3[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *puVar4;
    local_1a8 = (ulong *)*plVar3;
  }
  local_1a0 = plVar3[1];
  *plVar3 = (long)puVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
            (&local_220,(DrawTestSpec *)&DAT_00000001,(Storage)local_1a0);
  uVar7 = 0xf;
  if (local_1a8 != &local_198) {
    uVar7 = local_198;
  }
  if (uVar7 < local_220._M_string_length + local_1a0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      uVar8 = local_220.field_2._M_allocated_capacity;
    }
    if (local_220._M_string_length + local_1a0 <= (ulong)uVar8) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_1a8);
      goto LAB_0104fdda;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_220._M_dataplus._M_p);
LAB_0104fdda:
  psVar1 = puVar2 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2c0.field_2._M_allocated_capacity = *psVar1;
    local_2c0.field_2._8_8_ = puVar2[3];
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  }
  else {
    local_2c0.field_2._M_allocated_capacity = *psVar1;
    local_2c0._M_dataplus._M_p = (pointer)*puVar2;
  }
  local_2c0._M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  this_00 = (DrawTest *)operator_new(0x138);
  local_200 = node;
  deqp::gls::DrawTest::DrawTest
            (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,(char *)local_240,
             local_2c0._M_dataplus._M_p);
  iVar5 = 1;
  local_1f8.indexType = INDEXTYPE_SHORT;
  local_1f8.indexStorage = STORAGE_BUFFER;
  lVar6 = 0;
  do {
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"offset ","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<((ostringstream *)&local_1a8,iVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar7 = 0xf;
    if (local_2a0 != local_290) {
      uVar7 = local_290[0];
    }
    if (uVar7 < local_260._M_string_length + local_298) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        uVar8 = local_260.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_260._M_string_length + local_298) goto LAB_0104ffb2;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_2a0);
    }
    else {
LAB_0104ffb2:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_260._M_dataplus._M_p)
      ;
    }
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_270 = *plVar3;
      uStack_268 = puVar2[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar3;
      local_280 = (long *)*puVar2;
    }
    local_278 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
    local_1f8.indexPointerOffset = iVar5;
    deqp::gls::DrawTest::addIteration(this_00,&local_1f8,(char *)local_280);
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    iVar5 = (&DAT_01be5ba0)[lVar6];
    lVar6 = lVar6 + 1;
    if (lVar6 == 2) {
      tcu::TestNode::addChild(local_200,(TestNode *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      plVar3 = &local_230;
      if (local_240 != plVar3) {
        operator_delete(local_240,local_230 + 1);
        plVar3 = extraout_RAX;
      }
      iVar5 = (int)plVar3;
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar5 = extraout_EAX;
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* unalignedBufferGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_buffer", "unaligned buffer");

	genBasicSpec(spec, m_method);

	this->addChild(unalignedBufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];

		DE_ASSERT(indexTest.storage != gls::DrawTestSpec::STORAGE_USER);
		DE_ASSERT(!indexTest.aligned);
		tcu::TestCaseGroup*				group		= unalignedBufferGroup;

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
				  spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}